

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

Identifier * PDA::Transducer::Identifier::createIntegerLiteral(int value)

{
  Identifier *id;
  Identifier *in_RDI;
  
  (in_RDI->name)._M_dataplus._M_p = (pointer)&(in_RDI->name).field_2;
  (in_RDI->name)._M_string_length = 0;
  (in_RDI->name).field_2._M_local_buf[0] = L'\0';
  (in_RDI->decoratedName)._M_dataplus._M_p = (pointer)&(in_RDI->decoratedName).field_2;
  (in_RDI->decoratedName)._M_string_length = 0;
  (in_RDI->decoratedName).field_2._M_local_buf[0] = L'\0';
  (in_RDI->value).stringValue._M_dataplus._M_p = (pointer)&(in_RDI->value).stringValue.field_2;
  (in_RDI->value).stringValue._M_string_length = 0;
  (in_RDI->value).stringValue.field_2._M_local_buf[0] = L'\0';
  in_RDI->rbpOffset = 0;
  in_RDI->linkTo = -1;
  (in_RDI->functionArgs).
  super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->functionArgs).
  super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->functionArgs).
  super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI->context = Default;
  in_RDI->type = Integer;
  in_RDI->returnType = Undefined;
  (in_RDI->value).field_0 = (anon_union_8_2_6c0d51a1_for_IdentifierValue_0)(long)value;
  return in_RDI;
}

Assistant:

Identifier Identifier::createIntegerLiteral(const int value)
{
    Identifier id;
    id.type = Identifier::Type::Integer;
    id.value.intValue = value;
    return id;
}